

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/src/window.c"
                  ,0x297,"void glfwGetWindowFrameSize(GLFWwindow *, int *, int *, int *, int *)");
  }
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformGetWindowFrameSize((_GLFWwindow *)handle,left,top,right,bottom);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}